

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

bool __thiscall
S2Builder::EdgeChainSimplifier::TargetInputVertices
          (EdgeChainSimplifier *this,VertexId v,S2PolylineSimplifier *simplifier)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar6;
  
  pcVar1 = (this->site_vertices_->
           super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pcVar1[v].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
    paVar6 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
             pcVar1[v].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_;
  }
  else {
    paVar6 = &pcVar1[v].super_compact_array_base<int,_std::allocator<int>_>.field_7;
  }
  uVar5 = (ulong)((*(uint *)&pcVar1[v].super_compact_array_base<int,_std::allocator<int>_> &
                  0xffffff) << 2);
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (uVar5 == uVar4) break;
    bVar3 = S2PolylineSimplifier::TargetDisc
                      (simplifier,
                       (this->builder_->input_vertices_).
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + *(int *)((long)paVar6 + uVar4),
                       (S1ChordAngle)(this->builder_->edge_snap_radius_ca_).length2_);
    uVar2 = uVar4 + 4;
  } while (bVar3);
  return uVar5 == uVar4;
}

Assistant:

bool S2Builder::EdgeChainSimplifier::TargetInputVertices(
    VertexId v, S2PolylineSimplifier* simplifier) const {
  for (InputVertexId i : site_vertices_[v]) {
    if (!simplifier->TargetDisc(builder_.input_vertices_[i],
                                builder_.edge_snap_radius_ca_)) {
      return false;
    }
  }
  return true;
}